

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O2

void __thiscall
onmt::Tokenizer::Tokenizer
          (Tokenizer *this,string *sp_model_path,int sp_nbest_size,float sp_alpha,Mode mode,
          int flags,string *joiner)

{
  float local_4c;
  undefined1 local_48 [32];
  
  (this->super_ITokenizer)._vptr_ITokenizer = (_func_int **)&PTR__Tokenizer_003b60a8;
  local_4c = (float)sp_nbest_size;
  Options::Options(&this->_options,mode,flags,joiner);
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_subword_encoder).
  super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Options::validate(&this->_options);
  std::make_shared<onmt::SentencePiece_const,std::__cxx11::string_const&,int&,float&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
             (int *)sp_model_path,&local_4c);
  local_48._16_8_ = local_48._0_8_;
  local_48._24_8_ = local_48._8_8_;
  local_48._0_8_ = (pointer)0x0;
  local_48._8_8_ = 0;
  set_subword_encoder(this,(shared_ptr<const_onmt::SubwordEncoder> *)(local_48 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  return;
}

Assistant:

Tokenizer::Tokenizer(const std::string& sp_model_path,
                       int sp_nbest_size,
                       float sp_alpha,
                       Mode mode,
                       int flags,
                       const std::string& joiner)
    : _options(mode, flags, joiner)
  {
    _options.validate();
    set_subword_encoder(std::make_shared<const SentencePiece>(sp_model_path, sp_nbest_size, sp_alpha));
  }